

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_174::GUFAOptimizer::GUFAOptimizer
          (GUFAOptimizer *this,ContentOracle *oracle,bool optimizing,bool castAll)

{
  bool castAll_local;
  bool optimizing_local;
  ContentOracle *oracle_local;
  GUFAOptimizer *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__GUFAOptimizer_0309c0a0;
  this->oracle = oracle;
  this->optimizing = optimizing;
  this->castAll = castAll;
  this->optimized = false;
  std::
  unordered_map<wasm::Expression_*,_wasm::PossibleContents,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>_>_>
  ::unordered_map(&this->newContents);
  return;
}

Assistant:

GUFAOptimizer(ContentOracle& oracle, bool optimizing, bool castAll)
    : oracle(oracle), optimizing(optimizing), castAll(castAll) {}